

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<unsigned_int,_4> __thiscall
tcu::select<unsigned_int,4>
          (tcu *this,Vector<unsigned_int,_4> *trueVal,Vector<unsigned_int,_4> *falseVal,
          Vector<bool,_4> *cond)

{
  int i;
  long lVar1;
  uint *puVar2;
  undefined8 extraout_RDX;
  Vector<unsigned_int,_4> VVar3;
  
  Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    puVar2 = falseVal->m_data;
    if (cond->m_data[lVar1] != false) {
      puVar2 = trueVal->m_data;
    }
    *(uint *)(this + lVar1 * 4) = *puVar2;
    falseVal = (Vector<unsigned_int,_4> *)((long)falseVal + 4);
    trueVal = (Vector<unsigned_int,_4> *)((long)trueVal + 4);
  }
  VVar3.m_data[2] = (int)extraout_RDX;
  VVar3.m_data[3] = (int)((ulong)extraout_RDX >> 0x20);
  VVar3.m_data._0_8_ = this;
  return (Vector<unsigned_int,_4>)VVar3.m_data;
}

Assistant:

inline Vector<T, Size> select (const Vector<T, Size>& trueVal, const Vector<T, Size>& falseVal, const Vector<bool, Size>& cond)
{
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res[i] = cond[i] ? trueVal[i] : falseVal[i];
	return res;
}